

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_sound_thumbnail.cxx
# Opt level: O0

void __thiscall xray_re::xr_sound_thumbnail::save(xr_sound_thumbnail *this,xr_writer *w)

{
  uint local_1c;
  xr_writer *local_18;
  xr_writer *w_local;
  xr_sound_thumbnail *this_local;
  
  local_18 = w;
  w_local = (xr_writer *)this;
  xr_writer::w_chunk<unsigned_short>(w,0x810,&THM_VERSION_SOUNDPARAM);
  local_1c = 2;
  xr_writer::w_chunk<unsigned_int>(local_18,0x813,&local_1c);
  xr_writer::open_chunk(local_18,0x1000);
  xr_writer::w_float(local_18,this->quality);
  xr_writer::w_float(local_18,this->min_dist);
  xr_writer::w_float(local_18,this->max_dist);
  xr_writer::w_u32(local_18,this->game_type);
  xr_writer::close_chunk(local_18);
  xr_writer::open_chunk(local_18,0x1001);
  xr_writer::w_float(local_18,this->base_volume);
  xr_writer::close_chunk(local_18);
  xr_writer::open_chunk(local_18,0x1002);
  xr_writer::w_float(local_18,this->max_ai_dist);
  xr_writer::close_chunk(local_18);
  return;
}

Assistant:

void xr_sound_thumbnail::save(xr_writer& w) const
{
	w.w_chunk<uint16_t>(THM_CHUNK_VERSION, THM_VERSION_SOUNDPARAM);
	w.w_chunk<uint32_t>(THM_CHUNK_TYPE, THM_TYPE_SOUND);

	w.open_chunk(THM_CHUNK_SOUNDPARAM);
	w.w_float(quality);
	w.w_float(min_dist);
	w.w_float(max_dist);
	w.w_u32(game_type);
	w.close_chunk();

	w.open_chunk(THM_CHUNK_SOUNDPARAM_VOLUME);
	w.w_float(base_volume);
	w.close_chunk();

	w.open_chunk(THM_CHUNK_SOUNDPARAM_AI);
	w.w_float(max_ai_dist);
	w.close_chunk();
}